

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesFanSetSpeedTableMode(zes_fan_handle_t hFan,zes_fan_speed_table_t *speedTable)

{
  zes_pfnFanSetSpeedTableMode_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFanSetSpeedTableMode_t pfnSetSpeedTableMode;
  zes_fan_speed_table_t *speedTable_local;
  zes_fan_handle_t hFan_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Fan).pfnSetSpeedTableMode;
    if (p_Var1 == (zes_pfnFanSetSpeedTableMode_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hFan_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hFan_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hFan_local._4_4_ = (*p_Var1)(hFan,speedTable);
    }
  }
  else {
    hFan_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hFan_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFanSetSpeedTableMode(
    zes_fan_handle_t hFan,                          ///< [in] Handle for the component.
    const zes_fan_speed_table_t* speedTable         ///< [in] A table containing temperature/speed pairs.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFanSetSpeedTableMode_t pfnSetSpeedTableMode = [&result] {
        auto pfnSetSpeedTableMode = ze_lib::context->zesDdiTable.load()->Fan.pfnSetSpeedTableMode;
        if( nullptr == pfnSetSpeedTableMode ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetSpeedTableMode;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetSpeedTableMode( hFan, speedTable );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetSpeedTableMode = ze_lib::context->zesDdiTable.load()->Fan.pfnSetSpeedTableMode;
    if( nullptr == pfnSetSpeedTableMode ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetSpeedTableMode( hFan, speedTable );
    #endif
}